

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_intrusive_list.cpp
# Opt level: O2

void __thiscall IntrusiveList_OneElement_Test::TestBody(IntrusiveList_OneElement_Test *this)

{
  char *pcVar1;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_60;
  AssertHelper local_58;
  AssertionResult gtest_ar;
  intrusive_list<(anonymous_namespace)::value> v;
  value member;
  
  member.v = 0x2f;
  member.list_memb.prev = (value *)0x0;
  member.list_memb.next = (value *)0x0;
  pstore::broker::intrusive_list<(anonymous_namespace)::value>::intrusive_list(&v);
  pstore::broker::intrusive_list<(anonymous_namespace)::value>::insert_before
            (&v,&member,
             (value *)v.tail_._M_t.
                      super___uniq_ptr_impl<(anonymous_namespace)::value,_std::default_delete<(anonymous_namespace)::value>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_(anonymous_namespace)::value_*,_std::default_delete<(anonymous_namespace)::value>_>
                      .super__Head_base<0UL,_(anonymous_namespace)::value_*,_false>._M_head_impl);
  local_58.data_._0_4_ = 1;
  local_60._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::distance<pstore::broker::intrusive_list<(anonymous_namespace)::value>::iterator>
                 (*(value **)
                   ((long)v.head_._M_t.
                          super___uniq_ptr_impl<(anonymous_namespace)::value,_std::default_delete<(anonymous_namespace)::value>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_(anonymous_namespace)::value_*,_std::default_delete<(anonymous_namespace)::value>_>
                          .super__Head_base<0UL,_(anonymous_namespace)::value_*,_false>._M_head_impl
                   + 0x10),(iterator)
                           v.tail_._M_t.
                           super___uniq_ptr_impl<(anonymous_namespace)::value,_std::default_delete<(anonymous_namespace)::value>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_(anonymous_namespace)::value_*,_std::default_delete<(anonymous_namespace)::value>_>
                           .super__Head_base<0UL,_(anonymous_namespace)::value_*,_false>.
                           _M_head_impl);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)&gtest_ar,"1","std::distance (v.begin (), v.end ())",(int *)&local_58,
             (long *)&local_60);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_60);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/broker/test_intrusive_list.cpp"
               ,0x2b,pcVar1);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if (local_60._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_60._M_head_impl + 8))();
    }
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    local_60._M_head_impl._0_4_ = 0x2f;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&gtest_ar,"v.begin ()->v","47",
               *(int **)((long)v.head_._M_t.
                               super___uniq_ptr_impl<(anonymous_namespace)::value,_std::default_delete<(anonymous_namespace)::value>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_(anonymous_namespace)::value_*,_std::default_delete<(anonymous_namespace)::value>_>
                               .super__Head_base<0UL,_(anonymous_namespace)::value_*,_false>.
                               _M_head_impl + 0x10),(int *)&local_60);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_60);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar1 = "";
      }
      else {
        pcVar1 = *(char **)gtest_ar.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_58,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/broker/test_intrusive_list.cpp"
                 ,0x2c,pcVar1);
      testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
      testing::internal::AssertHelper::~AssertHelper(&local_58);
      if (local_60._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_60._M_head_impl + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    if (member.list_memb.prev != (value *)0x0) {
      ((member.list_memb.prev)->list_memb).next = member.list_memb.next;
    }
    if (member.list_memb.next != (value *)0x0) {
      ((member.list_memb.next)->list_memb).prev = member.list_memb.prev;
    }
    local_58.data_ = local_58.data_ & 0xffffffff00000000;
    local_60._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::distance<pstore::broker::intrusive_list<(anonymous_namespace)::value>::iterator>
                   (*(value **)
                     ((long)v.head_._M_t.
                            super___uniq_ptr_impl<(anonymous_namespace)::value,_std::default_delete<(anonymous_namespace)::value>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_(anonymous_namespace)::value_*,_std::default_delete<(anonymous_namespace)::value>_>
                            .super__Head_base<0UL,_(anonymous_namespace)::value_*,_false>.
                            _M_head_impl + 0x10),
                    (iterator)
                    v.tail_._M_t.
                    super___uniq_ptr_impl<(anonymous_namespace)::value,_std::default_delete<(anonymous_namespace)::value>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_(anonymous_namespace)::value_*,_std::default_delete<(anonymous_namespace)::value>_>
                    .super__Head_base<0UL,_(anonymous_namespace)::value_*,_false>._M_head_impl);
    testing::internal::CmpHelperEQ<int,long>
              ((internal *)&gtest_ar,"0","std::distance (v.begin (), v.end ())",(int *)&local_58,
               (long *)&local_60);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_60);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar1 = "";
      }
      else {
        pcVar1 = *(char **)gtest_ar.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_58,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/broker/test_intrusive_list.cpp"
                 ,0x2f,pcVar1);
      testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
      testing::internal::AssertHelper::~AssertHelper(&local_58);
      if (local_60._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_60._M_head_impl + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    local_60._M_head_impl =
         *(basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> **)
          ((long)v.head_._M_t.
                 super___uniq_ptr_impl<(anonymous_namespace)::value,_std::default_delete<(anonymous_namespace)::value>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_(anonymous_namespace)::value_*,_std::default_delete<(anonymous_namespace)::value>_>
                 .super__Head_base<0UL,_(anonymous_namespace)::value_*,_false>._M_head_impl + 0x10);
    local_58.data_ =
         (AssertHelperData *)
         v.tail_._M_t.
         super___uniq_ptr_impl<(anonymous_namespace)::value,_std::default_delete<(anonymous_namespace)::value>_>
         ._M_t.
         super__Tuple_impl<0UL,_(anonymous_namespace)::value_*,_std::default_delete<(anonymous_namespace)::value>_>
         .super__Head_base<0UL,_(anonymous_namespace)::value_*,_false>._M_head_impl;
    testing::internal::EqHelper::
    Compare<pstore::broker::intrusive_list<(anonymous_namespace)::value>::iterator,_pstore::broker::intrusive_list<(anonymous_namespace)::value>::iterator,_nullptr>
              ((EqHelper *)&gtest_ar,"v.begin ()","v.end ()",(iterator *)&local_60,
               (iterator *)&local_58);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_60);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar1 = "";
      }
      else {
        pcVar1 = *(char **)gtest_ar.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_58,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/broker/test_intrusive_list.cpp"
                 ,0x30,pcVar1);
      testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
      testing::internal::AssertHelper::~AssertHelper(&local_58);
      if (local_60._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_60._M_head_impl + 8))();
      }
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  pstore::broker::intrusive_list<(anonymous_namespace)::value>::~intrusive_list(&v);
  return;
}

Assistant:

TEST (IntrusiveList, OneElement) {
    value member{47};

    pstore::broker::intrusive_list<value> v;
    v.insert_before (&member, v.tail ());

    ASSERT_EQ (1, std::distance (v.begin (), v.end ()));
    EXPECT_EQ (v.begin ()->v, 47);

    v.erase (&member);
    EXPECT_EQ (0, std::distance (v.begin (), v.end ()));
    EXPECT_EQ (v.begin (), v.end ());
}